

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fifteen.cpp
# Opt level: O0

void __thiscall
Fifteen::moveGraphicTile(Fifteen *this,size_t rowSrc,size_t colSrc,size_t rowDst,size_t colDst)

{
  pointer this_00;
  reference pvVar1;
  pointer pQVar2;
  QIcon local_a0 [8];
  QIcon nullIcon;
  QPixmap local_88 [8];
  QPixmap pixmap;
  QIcon local_60 [8];
  __tuple_element_t<1UL,_tuple<unsigned_long,_unsigned_long>_> *local_58;
  type *tileSize;
  type *boardSize;
  _Head_base<0UL,_UndoMove_*,_false> local_38;
  vector<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
  *tiles;
  size_t colDst_local;
  size_t rowDst_local;
  size_t colSrc_local;
  size_t rowSrc_local;
  Fifteen *this_local;
  
  tiles = (vector<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
           *)colDst;
  colDst_local = rowDst;
  rowDst_local = colSrc;
  colSrc_local = rowSrc;
  rowSrc_local = (size_t)this;
  this_00 = std::unique_ptr<TilesBoard,_std::default_delete<TilesBoard>_>::operator->
                      (&this->tilesBoard);
  local_38._M_head_impl = (UndoMove *)TilesBoard::getTiles(this_00);
  std::unique_ptr<Controller,_std::default_delete<Controller>_>::operator->(&this->controller);
  Controller::getBoardAttributes((Controller *)&boardSize);
  tileSize = std::get<0ul,unsigned_long,unsigned_long>
                       ((tuple<unsigned_long,_unsigned_long> *)&boardSize);
  local_58 = std::get<1ul,unsigned_long,unsigned_long>
                       ((tuple<unsigned_long,_unsigned_long> *)&boardSize);
  pvVar1 = std::
           vector<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
           ::at((vector<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
                 *)local_38._M_head_impl,
                (size_type)
                ((long)&(tiles->
                        super__Vector_base<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + colDst_local * *tileSize));
  pQVar2 = std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>::operator->(pvVar1);
  pvVar1 = std::
           vector<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
           ::at((vector<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
                 *)local_38._M_head_impl,colSrc_local * *tileSize + rowDst_local);
  std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>::operator->(pvVar1);
  QAbstractButton::icon();
  QAbstractButton::setIcon((QIcon *)pQVar2);
  QIcon::~QIcon(local_60);
  QPixmap::QPixmap(local_88,(int)*local_58,(int)*local_58);
  QColor::QColor((QColor *)&nullIcon,white);
  QPixmap::fill((QColor *)local_88);
  QIcon::QIcon(local_a0,local_88);
  pvVar1 = std::
           vector<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
           ::at((vector<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
                 *)local_38._M_head_impl,colSrc_local * *tileSize + rowDst_local);
  pQVar2 = std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>::operator->(pvVar1);
  QAbstractButton::setIcon((QIcon *)pQVar2);
  QIcon::~QIcon(local_a0);
  QPixmap::~QPixmap(local_88);
  return;
}

Assistant:

void Fifteen::moveGraphicTile( size_t rowSrc, size_t colSrc, size_t rowDst, size_t colDst )
{
    auto& tiles = tilesBoard->getTiles();
    const auto [ boardSize, tileSize ] = controller->getBoardAttributes();

    tiles.at( rowDst * boardSize + colDst )->setIcon( tiles.at( rowSrc * boardSize + colSrc )->icon() );
    QPixmap pixmap( tileSize, tileSize );
    pixmap.fill( Qt::white );
    QIcon nullIcon( pixmap );
    tiles.at( rowSrc * boardSize + colSrc )->setIcon( nullIcon );
}